

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

SimpleString __thiscall
TestFailure::createDifferenceAtPosString
          (TestFailure *this,SimpleString *actual,size_t position,DifferenceFormat format)

{
  char *amount;
  char *pcVar1;
  SimpleString *pSVar2;
  SimpleString *rhs;
  SimpleString *in_RCX;
  SimpleString *in_RDI;
  int in_R8D;
  SimpleString markString;
  SimpleString differentString;
  SimpleString actualString;
  SimpleString paddingForPreventingOutOfBounds;
  size_t actualOffset;
  size_t halfOfExtraCharactersWindow;
  size_t extraCharactersWindow;
  SimpleString *result;
  SimpleString *in_stack_ffffffffffffff18;
  SimpleString *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff38;
  SimpleString *this_00;
  SimpleString in_stack_ffffffffffffff58;
  char local_a0 [24];
  SimpleString local_88;
  SimpleString local_80;
  char local_78 [8];
  SimpleString local_70 [6];
  SimpleString *local_40;
  undefined8 local_38;
  undefined8 local_30;
  byte local_25;
  int local_24;
  SimpleString *local_20;
  
  local_25 = 0;
  this_00 = in_RDI;
  local_24 = in_R8D;
  local_20 = in_RCX;
  SimpleString::SimpleString(in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
  local_30 = 0x14;
  local_38 = 10;
  pSVar2 = local_20;
  if (local_24 != 0) {
    pSVar2 = (SimpleString *)((long)local_20 * 3 + 1);
  }
  local_40 = pSVar2;
  SimpleString::SimpleString(this_00,(char *)in_RDI,(size_t)pSVar2);
  SimpleString::operator+(in_RDI,pSVar2);
  SimpleString::operator+(in_RDI,pSVar2);
  SimpleString::~SimpleString((SimpleString *)0x2101a6);
  StringFromFormat((char *)local_70,"difference starts at position %lu at: <",local_20);
  SimpleString::operator+=(pSVar2,in_stack_ffffffffffffff38);
  amount = SimpleString::asCharString(local_70);
  SimpleString::subString(in_RDI,(size_t)pSVar2,(size_t)amount);
  pcVar1 = SimpleString::asCharString(&local_80);
  StringFromFormat(local_78,"\t%s%s>\n",amount,pcVar1);
  SimpleString::operator+=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  SimpleString::~SimpleString((SimpleString *)0x210253);
  SimpleString::~SimpleString((SimpleString *)0x21025d);
  SimpleString::subString(in_RDI,(size_t)pSVar2,(size_t)amount);
  removeAllPrintableCharactersFrom((SimpleString *)in_stack_ffffffffffffff58.buffer_);
  SimpleString::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  SimpleString::~SimpleString((SimpleString *)0x2102aa);
  addMarkerToString((SimpleString *)in_stack_ffffffffffffff58.buffer_,(int)((ulong)this_00 >> 0x20))
  ;
  SimpleString::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  SimpleString::~SimpleString((SimpleString *)0x2102db);
  SimpleString::size((SimpleString *)0x2102e5);
  SimpleString::SimpleString(this_00,(char *)in_RDI,(size_t)pSVar2);
  pSVar2 = (SimpleString *)SimpleString::asCharString((SimpleString *)&stack0xffffffffffffff58);
  rhs = (SimpleString *)SimpleString::asCharString(&local_88);
  StringFromFormat(local_a0,"\t%s%s",pSVar2,rhs);
  SimpleString::operator+=(pSVar2,rhs);
  SimpleString::~SimpleString((SimpleString *)0x21035e);
  SimpleString::~SimpleString((SimpleString *)0x210368);
  local_25 = 1;
  SimpleString::~SimpleString((SimpleString *)0x21037a);
  SimpleString::~SimpleString((SimpleString *)0x210384);
  SimpleString::~SimpleString((SimpleString *)0x210391);
  SimpleString::~SimpleString((SimpleString *)0x21039e);
  if ((local_25 & 1) == 0) {
    SimpleString::~SimpleString((SimpleString *)0x21054c);
  }
  return (SimpleString)(char *)this_00;
}

Assistant:

SimpleString TestFailure::createDifferenceAtPosString(const SimpleString& actual, size_t position, DifferenceFormat format)
{
    SimpleString result;
    const size_t extraCharactersWindow = 20;
    const size_t halfOfExtraCharactersWindow = extraCharactersWindow / 2;
    const size_t actualOffset = (format == DIFFERENCE_STRING) ? position : (position * 3 + 1);

    SimpleString paddingForPreventingOutOfBounds (" ", halfOfExtraCharactersWindow);
    SimpleString actualString = paddingForPreventingOutOfBounds + actual + paddingForPreventingOutOfBounds;
    SimpleString differentString = StringFromFormat("difference starts at position %lu at: <", (unsigned long) position);

    result += "\n";
    result += StringFromFormat("\t%s%s>\n", differentString.asCharString(), actualString.subString(actualOffset, extraCharactersWindow).asCharString());

    SimpleString markString = actualString.subString(actualOffset, halfOfExtraCharactersWindow+1);
    markString = removeAllPrintableCharactersFrom(markString);
    markString = addMarkerToString(markString, halfOfExtraCharactersWindow);

    result += StringFromFormat("\t%s%s", SimpleString(" ", differentString.size()).asCharString(), markString.asCharString());
    return result;
}